

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_repeated_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::RepeatedMessageFieldGenerator::GenerateExtensionCode
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  Options *pOVar3;
  WrapperFieldGenerator *this_00;
  pointer pFVar4;
  string_view local_58;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  local_48;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  single_generator_1;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  local_30;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  single_generator;
  Printer *printer_local;
  RepeatedMessageFieldGenerator *this_local;
  
  pOVar3 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  WritePropertyDocComment(printer,pOVar3,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddDeprecatedFlag(&this->super_FieldGeneratorBase,printer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&single_generator,
             "$access_level$ static readonly pb::RepeatedExtension<$extended_type$, $type_name$> $property_name$ =\n  new pb::RepeatedExtension<$extended_type$, $type_name$>($number$, "
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,_single_generator);
  bVar2 = IsWrapperType((this->super_FieldGeneratorBase).descriptor_);
  if (bVar2) {
    this_00 = (WrapperFieldGenerator *)operator_new(0x48);
    pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
    pOVar3 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
    WrapperFieldGenerator::WrapperFieldGenerator(this_00,pFVar1,-1,pOVar3);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
    ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
              ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
                *)&local_30,(pointer)this_00);
    pFVar4 = std::
             unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
             ::operator->(&local_30);
    (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar4,printer);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ::~unique_ptr(&local_30);
  }
  else {
    pFVar4 = (pointer)operator_new(0x40);
    pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
    pOVar3 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
    MessageFieldGenerator::MessageFieldGenerator((MessageFieldGenerator *)pFVar4,pFVar1,-1,pOVar3);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
    ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
              ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
                *)&local_48,pFVar4);
    pFVar4 = std::
             unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
             ::operator->(&local_48);
    (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar4,printer);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ::~unique_ptr(&local_48);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,");\n");
  protobuf::io::Printer::Print<>(printer,local_58);
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::GenerateExtensionCode(io::Printer* printer) {
  WritePropertyDocComment(printer, options(), descriptor_);
  AddDeprecatedFlag(printer);
  printer->Print(
    variables_,
    "$access_level$ static readonly pb::RepeatedExtension<$extended_type$, $type_name$> $property_name$ =\n"
    "  new pb::RepeatedExtension<$extended_type$, $type_name$>($number$, ");
  if (IsWrapperType(descriptor_)) {
    std::unique_ptr<FieldGeneratorBase> single_generator(
      new WrapperFieldGenerator(descriptor_, -1, this->options()));
    single_generator->GenerateCodecCode(printer);
  } else {
    std::unique_ptr<FieldGeneratorBase> single_generator(
      new MessageFieldGenerator(descriptor_, -1, this->options()));
    single_generator->GenerateCodecCode(printer);
  }
  printer->Print(");\n");
}